

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::deserializedata<bool,bool,bool,bool>
               (binarydata *data,bool *args,bool *args_1,bool *args_2,bool *args_3)

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  string *args_3_00;
  undefined7 in_stack_fffffffffffffd18;
  bool *in_stack_fffffffffffffd20;
  bool *in_stack_fffffffffffffd28;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_fffffffffffffd30;
  istream *in_stack_fffffffffffffd38;
  PortableBinaryInputArchive *in_stack_fffffffffffffd40;
  string local_1d0 [32];
  stringstream local_1b0 [432];
  
  args_3_00 = local_1d0;
  binarydata::operator_cast_to_string
            ((binarydata *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,args_3_00,_Var2);
  std::__cxx11::string::~string(local_1d0);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (Options *)in_stack_fffffffffffffd30);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             (bool *)CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffd18),(bool *)args_3_00)
  ;
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x21323d);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }